

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O0

void __thiscall
branch_and_reduce_algorithm::get_articulation_points(branch_and_reduce_algorithm *this)

{
  size_type sVar1;
  reference pvVar2;
  int local_24;
  value_type_conflict1 local_20;
  int i;
  value_type_conflict1 local_18;
  int local_14;
  branch_and_reduce_algorithm *pbStack_10;
  int n;
  branch_and_reduce_algorithm *this_local;
  
  this->current_dfs_num = 0;
  pbStack_10 = this;
  sVar1 = std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::size(&this->adj);
  local_14 = (int)sVar1;
  std::vector<int,_std::allocator<int>_>::resize(&this->visited,0);
  std::vector<int,_std::allocator<int>_>::resize(&this->minNr,0);
  std::vector<int,_std::allocator<int>_>::resize(&this->articulation_points,0);
  local_18 = -1;
  std::vector<int,_std::allocator<int>_>::resize(&this->visited,(long)local_14,&local_18);
  i = -1;
  std::vector<int,_std::allocator<int>_>::resize(&this->minNr,(long)local_14,&i);
  local_20 = 0;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->articulation_points,(long)local_14,&local_20);
  for (local_24 = 0; local_24 < local_14; local_24 = local_24 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)local_24);
    if (*pvVar2 < 0) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->visited,(long)local_24);
      if (*pvVar2 < 0) {
        dfs_root(this,local_24);
      }
    }
  }
  return;
}

Assistant:

void branch_and_reduce_algorithm::get_articulation_points()
{
    current_dfs_num = 0;
    const int n = adj.size();

    visited.resize(0);
    minNr.resize(0);
    articulation_points.resize(0);

    visited.resize(n, -1);
    minNr.resize(n, -1);
    articulation_points.resize(n, 0);

    // Start DFS
    for (int i = 0; i < n; i++)
        if (x[i] < 0 && visited[i] < 0) // node active but not yet visited
            dfs_root(i);
}